

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fxuSelect.c
# Opt level: O3

int Fxu_Select(Fxu_Matrix *p,Fxu_Single **ppSingle,Fxu_Double **ppDouble)

{
  long lVar1;
  Fxu_Pair *pFVar2;
  uint uVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  uint uVar7;
  Fxu_Single *pFVar8;
  Fxu_Double *pFVar9;
  uint uVar10;
  int iVar11;
  Fxu_Matrix *p_00;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  int nVarsC1;
  int piVarsC2 [10];
  int iVar1C;
  Fxu_Double *pDoubles [20];
  Fxu_Single *pSingles [20];
  Fxu_Single *pDComplS [20];
  Fxu_Double *pSCompl [20];
  int local_320;
  int local_31c;
  uint local_318 [12];
  uint local_2e8 [12];
  long local_2b8 [20];
  long local_218 [20];
  long local_178 [20];
  long local_d8 [21];
  
  uVar12 = 0;
  memset(local_218,0,0xa0);
  memset(local_2b8,0,0xa0);
  memset(local_d8,0,0xa0);
  memset(local_178,0,0xa0);
  do {
    pFVar8 = Fxu_HeapSingleGetMax(p->pHeapSingle);
    local_218[uVar12] = (long)pFVar8;
    if (pFVar8 == (Fxu_Single *)0x0) {
      if (uVar12 != 0) goto LAB_00444236;
      bVar4 = true;
      uVar12 = 0;
      goto LAB_00444262;
    }
    uVar12 = uVar12 + 1;
  } while (uVar12 != 0x14);
  uVar12 = 0x14;
LAB_00444236:
  uVar12 = uVar12 & 0xffffffff;
  uVar13 = 0;
  do {
    if ((Fxu_Single *)local_218[uVar13] != (Fxu_Single *)0x0) {
      Fxu_HeapSingleInsert(p->pHeapSingle,(Fxu_Single *)local_218[uVar13]);
    }
    uVar13 = uVar13 + 1;
  } while (uVar12 != uVar13);
  bVar4 = false;
LAB_00444262:
  uVar13 = 0;
  do {
    p_00 = (Fxu_Matrix *)p->pHeapDouble;
    pFVar9 = Fxu_HeapDoubleGetMax((Fxu_HeapDouble *)p_00);
    local_2b8[uVar13] = (long)pFVar9;
    if (pFVar9 == (Fxu_Double *)0x0) {
      if (uVar13 != 0) goto LAB_00444292;
      bVar5 = true;
      uVar13 = 0;
      goto LAB_004442ba;
    }
    uVar13 = uVar13 + 1;
  } while (uVar13 != 0x14);
  uVar13 = 0x14;
LAB_00444292:
  uVar13 = uVar13 & 0xffffffff;
  uVar14 = 0;
  do {
    if ((Fxu_Double *)local_2b8[uVar14] != (Fxu_Double *)0x0) {
      p_00 = (Fxu_Matrix *)p->pHeapDouble;
      Fxu_HeapDoubleInsert((Fxu_HeapDouble *)p_00,(Fxu_Double *)local_2b8[uVar14]);
    }
    uVar14 = uVar14 + 1;
  } while (uVar13 != uVar14);
  bVar5 = false;
LAB_004442ba:
  if (!bVar4) {
    uVar14 = 0;
    do {
      lVar1 = local_218[uVar14];
      if (lVar1 != 0) {
        local_2e8[0] = **(uint **)(lVar1 + 0x10) ^ 1;
        local_318[0] = **(uint **)(lVar1 + 0x18) ^ 1;
        if (**(uint **)(lVar1 + 0x18) == 0xfffffffe || **(uint **)(lVar1 + 0x10) == 0xfffffffe) {
          pFVar9 = (Fxu_Double *)0x0;
        }
        else {
          if ((int)local_318[0] <= (int)local_2e8[0]) {
            __assert_fail("iVar1C < iVar2C",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/fxu/fxuSelect.c"
                          ,0xea,
                          "Fxu_Double *Fxu_MatrixFindComplementSingle(Fxu_Matrix *, Fxu_Single *)");
          }
          p_00 = p;
          pFVar9 = Fxu_MatrixFindDouble(p,(int *)local_2e8,(int *)local_318,1,1);
        }
        local_d8[uVar14] = (long)pFVar9;
      }
      uVar14 = uVar14 + 1;
    } while (uVar12 != uVar14);
  }
  if (!bVar5) {
    uVar14 = 0;
    do {
      pFVar9 = (Fxu_Double *)local_2b8[uVar14];
      if (pFVar9 != (Fxu_Double *)0x0) {
        pFVar2 = (pFVar9->lPairs).pHead;
        if ((pFVar2->nLits1 == 1) && (pFVar2->nLits2 == 1)) {
          Fxu_MatrixGetDoubleVars
                    (p_00,pFVar9,(int *)local_2e8,(int *)local_318,&local_31c,&local_320);
          if (local_31c != 1) {
            __assert_fail("nVarsC1 == 1",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/fxu/fxuSelect.c"
                          ,0x104,
                          "Fxu_Single *Fxu_MatrixFindComplementDouble2(Fxu_Matrix *, Fxu_Double *)")
            ;
          }
          if (local_320 != 1) {
            __assert_fail("nVarsC2 == 1",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/fxu/fxuSelect.c"
                          ,0x105,
                          "Fxu_Single *Fxu_MatrixFindComplementDouble2(Fxu_Matrix *, Fxu_Double *)")
            ;
          }
          if ((int)local_318[0] <= (int)local_2e8[0]) {
            __assert_fail("iVar1 < iVar2",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/fxu/fxuSelect.c"
                          ,0x108,
                          "Fxu_Single *Fxu_MatrixFindComplementDouble2(Fxu_Matrix *, Fxu_Double *)")
            ;
          }
          if (local_318[0] != 0xfffffffe && local_2e8[0] != 0xfffffffe) {
            uVar10 = local_318[0] ^ 1;
            uVar7 = local_2e8[0] ^ 1;
            uVar3 = uVar10;
            if ((int)uVar7 < (int)uVar10) {
              uVar3 = uVar7;
            }
            if ((int)uVar7 <= (int)uVar10) {
              uVar7 = uVar10;
            }
            for (pFVar8 = (p->lSingles).pHead; pFVar8 != (Fxu_Single *)0x0; pFVar8 = pFVar8->pNext)
            {
              if ((pFVar8->pVar1->iVar == uVar3) && (pFVar8->pVar2->iVar == uVar7))
              goto LAB_0044444c;
            }
          }
        }
        pFVar8 = (Fxu_Single *)0x0;
LAB_0044444c:
        local_178[uVar14] = (long)pFVar8;
      }
      uVar14 = uVar14 + 1;
    } while (uVar14 != uVar13);
  }
  iVar6 = -1;
  if (!bVar4) {
    uVar14 = 0;
    do {
      iVar11 = ((Fxu_Single *)local_218[uVar14])->Weight;
      pFVar9 = (Fxu_Double *)local_d8[uVar14];
      if (pFVar9 != (Fxu_Double *)0x0) {
        pFVar2 = (pFVar9->lPairs).pHead;
        iVar11 = iVar11 + pFVar9->Weight + pFVar2->nLits1 + pFVar2->nLits2;
      }
      if (iVar6 < iVar11) {
        *ppSingle = (Fxu_Single *)local_218[uVar14];
        *ppDouble = pFVar9;
        iVar6 = iVar11;
      }
      uVar14 = uVar14 + 1;
    } while (uVar12 != uVar14);
  }
  if (!bVar5) {
    uVar12 = 0;
    do {
      pFVar9 = (Fxu_Double *)local_2b8[uVar12];
      iVar11 = pFVar9->Weight;
      pFVar8 = (Fxu_Single *)local_178[uVar12];
      if (pFVar8 != (Fxu_Single *)0x0) {
        pFVar2 = (pFVar9->lPairs).pHead;
        iVar11 = iVar11 + pFVar8->Weight + pFVar2->nLits1 + pFVar2->nLits2;
      }
      if (iVar6 < iVar11) {
        *ppSingle = pFVar8;
        *ppDouble = pFVar9;
        iVar6 = iVar11;
      }
      uVar12 = uVar12 + 1;
    } while (uVar13 != uVar12);
  }
  return iVar6;
}

Assistant:

int Fxu_Select( Fxu_Matrix * p, Fxu_Single ** ppSingle, Fxu_Double ** ppDouble )
{
    // the top entries
    Fxu_Single * pSingles[MAX_SIZE_LOOKAHEAD] = {0};
    Fxu_Double * pDoubles[MAX_SIZE_LOOKAHEAD] = {0};
    // the complements
    Fxu_Double * pSCompl[MAX_SIZE_LOOKAHEAD] = {0};
    Fxu_Single * pDComplS[MAX_SIZE_LOOKAHEAD] = {0};
    Fxu_Double * pDComplD[MAX_SIZE_LOOKAHEAD] = {0};
    Fxu_Pair * pPair;
    int nSingles;
    int nDoubles;
    int i;
    int WeightBest;
    int WeightCur;
    int iNum, fBestS;

    // collect the top entries from the queues
    for ( nSingles = 0; nSingles < MAX_SIZE_LOOKAHEAD; nSingles++ )
    {
        pSingles[nSingles] = Fxu_HeapSingleGetMax( p->pHeapSingle );
        if ( pSingles[nSingles] == NULL )
            break;
    }
    // put them back into the queue
    for ( i = 0; i < nSingles; i++ )
        if ( pSingles[i] )
            Fxu_HeapSingleInsert( p->pHeapSingle, pSingles[i] );
        
    // the same for doubles
    // collect the top entries from the queues
    for ( nDoubles = 0; nDoubles < MAX_SIZE_LOOKAHEAD; nDoubles++ )
    {
        pDoubles[nDoubles] = Fxu_HeapDoubleGetMax( p->pHeapDouble );
        if ( pDoubles[nDoubles] == NULL )
            break;
    }
    // put them back into the queue
    for ( i = 0; i < nDoubles; i++ )
        if ( pDoubles[i] )
            Fxu_HeapDoubleInsert( p->pHeapDouble, pDoubles[i] );

    // for each single, find the complement double (if any)
    for ( i = 0; i < nSingles; i++ )
        if ( pSingles[i] )
            pSCompl[i] = Fxu_MatrixFindComplementSingle( p, pSingles[i] );

    // for each double, find the complement single or double (if any)
    for ( i = 0; i < nDoubles; i++ )
        if ( pDoubles[i] )
        {
            pPair = pDoubles[i]->lPairs.pHead;
            if ( pPair->nLits1 == 1 && pPair->nLits2 == 1 )
            {
                pDComplS[i] = Fxu_MatrixFindComplementDouble2( p, pDoubles[i] );
                pDComplD[i] = NULL;
            }
//            else if ( pPair->nLits1 == 2 && pPair->nLits2 == 2 )
//            {
//                pDComplS[i] = NULL;
//                pDComplD[i] = Fxu_MatrixFindComplementDouble4( p, pDoubles[i] );
//            }
            else
            {
                pDComplS[i] = NULL;
                pDComplD[i] = NULL;
            }
        }

    // select the best pair
    WeightBest = -1;
    for ( i = 0; i < nSingles; i++ )
    {
        WeightCur = pSingles[i]->Weight;
        if ( pSCompl[i] )
        {
            // add the weight of the double
            WeightCur += pSCompl[i]->Weight;
            // there is no need to implement this double, so...
            pPair      = pSCompl[i]->lPairs.pHead;
            WeightCur += pPair->nLits1 + pPair->nLits2;
        }
        if ( WeightBest < WeightCur )
        {
            WeightBest = WeightCur;
            *ppSingle = pSingles[i];
            *ppDouble = pSCompl[i];
            fBestS = 1;
            iNum = i;
        }
    }
    for ( i = 0; i < nDoubles; i++ )
    {
        WeightCur = pDoubles[i]->Weight;
        if ( pDComplS[i] )
        {
            // add the weight of the single
            WeightCur += pDComplS[i]->Weight;
            // there is no need to implement this double, so...
            pPair      = pDoubles[i]->lPairs.pHead;
            WeightCur += pPair->nLits1 + pPair->nLits2;
        }
        if ( WeightBest < WeightCur )
        {
            WeightBest = WeightCur;
            *ppSingle = pDComplS[i];
            *ppDouble = pDoubles[i];
            fBestS = 0;
            iNum = i;
        }
    }
/*
    // print the statistics
    printf( "\n" );
    for ( i = 0; i < nSingles; i++ )
    {
        printf( "Single #%d: Weight = %3d. ", i, pSingles[i]->Weight );
        printf( "Compl: " );
        if ( pSCompl[i] == NULL )
            printf( "None." );
        else
            printf( "D  Weight = %3d  Sum = %3d", 
                pSCompl[i]->Weight, pSCompl[i]->Weight + pSingles[i]->Weight );
        printf( "\n" );
    }
    printf( "\n" );
    for ( i = 0; i < nDoubles; i++ )
    {
        printf( "Double #%d: Weight = %3d. ", i, pDoubles[i]->Weight );
        printf( "Compl: " );
        if ( pDComplS[i] == NULL && pDComplD[i] == NULL )
            printf( "None." );
        else if ( pDComplS[i] )
            printf( "S  Weight = %3d  Sum = %3d", 
                pDComplS[i]->Weight, pDComplS[i]->Weight + pDoubles[i]->Weight );
        else if ( pDComplD[i] )
            printf( "D  Weight = %3d  Sum = %3d", 
                pDComplD[i]->Weight, pDComplD[i]->Weight + pDoubles[i]->Weight );
        printf( "\n" );
    }
    if ( WeightBest == -1 )
        printf( "Selected NONE\n" );
    else
    {
        printf( "Selected = %s.  ", fBestS? "S": "D" );
        printf( "Number = %d.  ", iNum );
        printf( "Weight = %d.\n", WeightBest );
    }
    printf( "\n" );
*/
    return WeightBest;
}